

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O0

void __thiscall kj::TestCase28::run(TestCase28 *this)

{
  bool bVar1;
  int *piVar2;
  int **ppiVar3;
  String *pSVar4;
  String **ppSVar5;
  OneOf<int,_float,_kj::String> *pOVar6;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func;
  Type *extraout_RDX_01;
  Type *extraout_RDX_02;
  Type *extraout_RDX_03;
  Type *func_00;
  Type *extraout_RDX_04;
  char (*extraout_RDX_05) [4];
  char (*extraout_RDX_06) [4];
  char (*params) [4];
  char (*extraout_RDX_07) [4];
  bool local_46c;
  bool local_46b;
  bool local_46a;
  bool local_469;
  undefined1 local_468 [4];
  bool _kj_shouldLog_25;
  bool _kj_shouldLog_24;
  bool _kj_shouldLog_23;
  bool _kj_shouldLog_22;
  OneOf<int,_float,_kj::String> var2;
  Fault local_440;
  Maybe<kj::String_&> local_438;
  String *local_430;
  String *_kj_result_3;
  String *pSStack_420;
  bool _kj_shouldLog_21;
  Fault local_418;
  Maybe<kj::String_&> local_410;
  String *local_408;
  String *_kj_result_2;
  Maybe<float_&> MStack_3f8;
  bool _kj_shouldLog_20;
  bool local_3e9;
  Maybe<int_&> MStack_3e8;
  bool _kj_shouldLog_19;
  bool local_3dc;
  bool local_3db;
  bool local_3da;
  bool local_3d9;
  undefined1 local_3d8 [4];
  bool _kj_shouldLog_18;
  bool _kj_shouldLog_17;
  bool _kj_shouldLog_16;
  bool _kj_shouldLog_15;
  bool local_3b9;
  Maybe<kj::String_&> MStack_3b8;
  bool _kj_shouldLog_14;
  bool local_3a9;
  Maybe<float_&> MStack_3a8;
  bool _kj_shouldLog_13;
  int *local_3a0;
  Fault local_398;
  Maybe<int_&> local_390;
  int *local_388;
  int *_kj_result_1;
  int *piStack_378;
  bool _kj_shouldLog_12;
  Fault local_370;
  Maybe<int_&> local_368;
  int *local_360;
  int *_kj_result;
  undefined1 *puStack_350;
  bool _kj_shouldLog_11;
  Maybe<kj::Exception> local_348;
  bool local_1e1;
  undefined1 *puStack_1e0;
  bool _kj_shouldLog_10;
  Maybe<kj::Exception> local_1d8;
  int local_78;
  bool local_74;
  bool local_73;
  bool local_72;
  bool local_71;
  int local_70;
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  Maybe<kj::String_&> MStack_68;
  bool _kj_shouldLog_5;
  bool local_59;
  Maybe<float_&> MStack_58;
  bool _kj_shouldLog_4;
  bool local_49;
  Maybe<int_&> MStack_48;
  bool _kj_shouldLog_3;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 local_30 [8];
  OneOf<int,_float,_kj::String> var;
  TestCase28 *this_local;
  
  var.field_1._16_8_ = this;
  OneOf<int,_float,_kj::String>::OneOf((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = OneOf<int,_float,_kj::String>::is<int>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_3d = _::Debug::shouldLog(ERROR);
    while (local_3d != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x1f,ERROR,"\"failed: expected \" \"!(var.is<int>())\"",
                 (char (*) [34])"failed: expected !(var.is<int>())");
      local_3d = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<float>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_3e = _::Debug::shouldLog(ERROR);
    while (local_3e != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x20,ERROR,"\"failed: expected \" \"!(var.is<float>())\"",
                 (char (*) [36])"failed: expected !(var.is<float>())");
      local_3e = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<kj::String>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_3f = _::Debug::shouldLog(ERROR);
    while (local_3f != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x21,ERROR,"\"failed: expected \" \"!(var.is<String>())\"",
                 (char (*) [37])"failed: expected !(var.is<String>())");
      local_3f = false;
    }
  }
  MStack_48 = OneOf<int,_float,_kj::String>::tryGet<int>((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<int_&>::operator==(&stack0xffffffffffffffb8,(void *)0x0);
  if (!bVar1) {
    local_49 = _::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x22,ERROR,"\"failed: expected \" \"var.tryGet<int>() == nullptr\"",
                 (char (*) [46])"failed: expected var.tryGet<int>() == nullptr");
      local_49 = false;
    }
  }
  MStack_58 = OneOf<int,_float,_kj::String>::tryGet<float>
                        ((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<float_&>::operator==(&stack0xffffffffffffffa8,(void *)0x0);
  if (!bVar1) {
    local_59 = _::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x23,ERROR,"\"failed: expected \" \"var.tryGet<float>() == nullptr\"",
                 (char (*) [48])"failed: expected var.tryGet<float>() == nullptr");
      local_59 = false;
    }
  }
  MStack_68 = OneOf<int,_float,_kj::String>::tryGet<kj::String>
                        ((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<kj::String_&>::operator==(&stack0xffffffffffffff98,(void *)0x0);
  if (!bVar1) {
    _kj_shouldLog_6 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x24,ERROR,"\"failed: expected \" \"var.tryGet<String>() == nullptr\"",
                 (char (*) [49])"failed: expected var.tryGet<String>() == nullptr");
      _kj_shouldLog_6 = false;
    }
  }
  local_70 = 0x7b;
  OneOf<int,float,kj::String>::init<int,int>((OneOf<int,float,kj::String> *)local_30,&local_70);
  bVar1 = OneOf<int,_float,_kj::String>::is<int>((OneOf<int,_float,_kj::String> *)local_30);
  if (!bVar1) {
    local_71 = _::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x28,ERROR,"\"failed: expected \" \"var.is<int>()\"",
                 (char (*) [31])"failed: expected var.is<int>()");
      local_71 = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<float>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_72 = _::Debug::shouldLog(ERROR);
    while (local_72 != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x29,ERROR,"\"failed: expected \" \"!(var.is<float>())\"",
                 (char (*) [36])"failed: expected !(var.is<float>())");
      local_72 = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<kj::String>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_73 = _::Debug::shouldLog(ERROR);
    while (local_73 != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x2a,ERROR,"\"failed: expected \" \"!(var.is<String>())\"",
                 (char (*) [37])"failed: expected !(var.is<String>())");
      local_73 = false;
    }
  }
  piVar2 = OneOf<int,_float,_kj::String>::get<int>((OneOf<int,_float,_kj::String> *)local_30);
  func = extraout_RDX;
  if (*piVar2 != 0x7b) {
    local_74 = _::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_74 != false) {
      local_78 = 0x7b;
      piVar2 = OneOf<int,_float,_kj::String>::get<int>((OneOf<int,_float,_kj::String> *)local_30);
      _::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(123) == (var.get<int>())\", 123, var.get<int>()",
                 (char (*) [43])"failed: expected (123) == (var.get<int>())",&local_78,piVar2);
      func = extraout_RDX_01;
      local_74 = false;
    }
  }
  puStack_1e0 = local_30;
  runCatchingExceptions<kj::TestCase28::run()::__0>(&local_1d8,(kj *)&stack0xfffffffffffffe20,func);
  bVar1 = Maybe<kj::Exception>::operator!=(&local_1d8,(void *)0x0);
  Maybe<kj::Exception>::~Maybe(&local_1d8);
  func_00 = extraout_RDX_02;
  if (!bVar1) {
    local_1e1 = _::Debug::shouldLog(ERROR);
    func_00 = extraout_RDX_03;
    while (local_1e1 != false) {
      _::Debug::log<char_const(&)[85]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x2e,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { var.get<float>(); }) != nullptr\""
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { var.get<float>(); }) != nullptr"
                );
      func_00 = extraout_RDX_04;
      local_1e1 = false;
    }
  }
  puStack_350 = local_30;
  runCatchingExceptions<kj::TestCase28::run()::__1>
            (&local_348,(kj *)&stack0xfffffffffffffcb0,func_00);
  bVar1 = Maybe<kj::Exception>::operator!=(&local_348,(void *)0x0);
  Maybe<kj::Exception>::~Maybe(&local_348);
  if (!bVar1) {
    _kj_result._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result._7_1_ != false) {
      _::Debug::log<char_const(&)[86]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x2f,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { var.get<String>(); }) != nullptr\""
                 ,(char (*) [86])
                  "failed: expected ::kj::runCatchingExceptions([&]() { var.get<String>(); }) != nullptr"
                );
      _kj_result._7_1_ = false;
    }
  }
  local_368 = OneOf<int,_float,_kj::String>::tryGet<int>((OneOf<int,_float,_kj::String> *)local_30);
  local_360 = _::readMaybe<int>(&local_368);
  if (local_360 == (int *)0x0) {
    _::Debug::Fault::Fault
              (&local_370,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x32,FAILED,"var.tryGet<int>() != nullptr","");
    _::Debug::Fault::fatal(&local_370);
  }
  ppiVar3 = mv<int*>(&local_360);
  piStack_378 = *ppiVar3;
  if (*piStack_378 != 0x7b) {
    _kj_result_1._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_1._7_1_ != false) {
      _kj_result_1._0_4_ = 0x7b;
      local_390 = OneOf<int,_float,_kj::String>::tryGet<int>
                            ((OneOf<int,_float,_kj::String> *)local_30);
      local_388 = _::readMaybe<int>(&local_390);
      if (local_388 == (int *)0x0) {
        _::Debug::Fault::Fault
                  (&local_398,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x32,FAILED,"var.tryGet<int>() != nullptr","");
        _::Debug::Fault::fatal(&local_398);
      }
      ppiVar3 = mv<int*>(&local_388);
      local_3a0 = *ppiVar3;
      _::Debug::log<char_const(&)[374],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"(123) == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\\\", 50, ::kj::Exception::Type::FAILED, \\\"var.tryGet<int>()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", 123, (*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 50, ::kj::Exception::Type::FAILED, \"var.tryGet<int>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [374])
                  "failed: expected (123) == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 50, ::kj::Exception::Type::FAILED, \"var.tryGet<int>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(int *)&_kj_result_1,local_3a0);
      _kj_result_1._7_1_ = false;
    }
  }
  MStack_3a8 = OneOf<int,_float,_kj::String>::tryGet<float>
                         ((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<float_&>::operator==(&stack0xfffffffffffffc58,(void *)0x0);
  if (!bVar1) {
    local_3a9 = _::Debug::shouldLog(ERROR);
    while (local_3a9 != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x33,ERROR,"\"failed: expected \" \"var.tryGet<float>() == nullptr\"",
                 (char (*) [48])"failed: expected var.tryGet<float>() == nullptr");
      local_3a9 = false;
    }
  }
  MStack_3b8 = OneOf<int,_float,_kj::String>::tryGet<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<kj::String_&>::operator==(&stack0xfffffffffffffc48,(void *)0x0);
  params = extraout_RDX_05;
  if (!bVar1) {
    local_3b9 = _::Debug::shouldLog(ERROR);
    params = extraout_RDX_06;
    while (local_3b9 != false) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x34,ERROR,"\"failed: expected \" \"var.tryGet<String>() == nullptr\"",
                 (char (*) [49])"failed: expected var.tryGet<String>() == nullptr");
      params = extraout_RDX_07;
      local_3b9 = false;
    }
  }
  str<char_const(&)[4]>((String *)local_3d8,(kj *)0x654402,params);
  OneOf<int,float,kj::String>::init<kj::String,kj::String>
            ((OneOf<int,float,kj::String> *)local_30,(String *)local_3d8);
  String::~String((String *)local_3d8);
  bVar1 = OneOf<int,_float,_kj::String>::is<int>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_3d9 = _::Debug::shouldLog(ERROR);
    while (local_3d9 != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x38,ERROR,"\"failed: expected \" \"!(var.is<int>())\"",
                 (char (*) [34])"failed: expected !(var.is<int>())");
      local_3d9 = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<float>((OneOf<int,_float,_kj::String> *)local_30);
  if (bVar1) {
    local_3da = _::Debug::shouldLog(ERROR);
    while (local_3da != false) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"!(var.is<float>())\"",
                 (char (*) [36])"failed: expected !(var.is<float>())");
      local_3da = false;
    }
  }
  bVar1 = OneOf<int,_float,_kj::String>::is<kj::String>((OneOf<int,_float,_kj::String> *)local_30);
  if (!bVar1) {
    local_3db = _::Debug::shouldLog(ERROR);
    while (local_3db != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x3a,ERROR,"\"failed: expected \" \"var.is<String>()\"",
                 (char (*) [34])"failed: expected var.is<String>()");
      local_3db = false;
    }
  }
  pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>((OneOf<int,_float,_kj::String> *)local_30)
  ;
  bVar1 = kj::operator==("foo",pSVar4);
  if (!bVar1) {
    local_3dc = _::Debug::shouldLog(ERROR);
    while (local_3dc != false) {
      pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_30);
      _::Debug::log<char_const(&)[48],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x3c,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (var.get<String>())\", \"foo\", var.get<String>()"
                 ,(char (*) [48])"failed: expected (\"foo\") == (var.get<String>())",
                 (char (*) [4])0x654402,pSVar4);
      local_3dc = false;
    }
  }
  MStack_3e8 = OneOf<int,_float,_kj::String>::tryGet<int>((OneOf<int,_float,_kj::String> *)local_30)
  ;
  bVar1 = Maybe<int_&>::operator==(&stack0xfffffffffffffc18,(void *)0x0);
  if (!bVar1) {
    local_3e9 = _::Debug::shouldLog(ERROR);
    while (local_3e9 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"var.tryGet<int>() == nullptr\"",
                 (char (*) [46])"failed: expected var.tryGet<int>() == nullptr");
      local_3e9 = false;
    }
  }
  MStack_3f8 = OneOf<int,_float,_kj::String>::tryGet<float>
                         ((OneOf<int,_float,_kj::String> *)local_30);
  bVar1 = Maybe<float_&>::operator==(&stack0xfffffffffffffc08,(void *)0x0);
  if (!bVar1) {
    _kj_result_2._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_2._7_1_ != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"var.tryGet<float>() == nullptr\"",
                 (char (*) [48])"failed: expected var.tryGet<float>() == nullptr");
      _kj_result_2._7_1_ = false;
    }
  }
  local_410 = OneOf<int,_float,_kj::String>::tryGet<kj::String>
                        ((OneOf<int,_float,_kj::String> *)local_30);
  local_408 = _::readMaybe<kj::String>(&local_410);
  if (local_408 == (String *)0x0) {
    _::Debug::Fault::Fault
              (&local_418,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x40,FAILED,"var.tryGet<String>() != nullptr","");
    _::Debug::Fault::fatal(&local_418);
  }
  ppSVar5 = mv<kj::String*>(&local_408);
  pSStack_420 = *ppSVar5;
  bVar1 = kj::operator==("foo",pSStack_420);
  if (!bVar1) {
    _kj_result_3._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)_kj_result_3._7_1_ != false) {
      local_438 = OneOf<int,_float,_kj::String>::tryGet<kj::String>
                            ((OneOf<int,_float,_kj::String> *)local_30);
      local_430 = _::readMaybe<kj::String>(&local_438);
      if (local_430 == (String *)0x0) {
        _::Debug::Fault::Fault
                  (&local_440,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x40,FAILED,"var.tryGet<String>() != nullptr","");
        _::Debug::Fault::fatal(&local_440);
      }
      ppSVar5 = mv<kj::String*>(&local_430);
      var2.field_1._16_8_ = *ppSVar5;
      _::Debug::log<char_const(&)[382],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\\\", 64, ::kj::Exception::Type::FAILED, \\\"var.tryGet<String>()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", \"foo\", (*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 64, ::kj::Exception::Type::FAILED, \"var.tryGet<String>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [382])
                  "failed: expected (\"foo\") == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 64, ::kj::Exception::Type::FAILED, \"var.tryGet<String>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(char (*) [4])0x654402,(String *)var2.field_1._16_8_);
      _kj_result_3._7_1_ = false;
    }
  }
  pOVar6 = mv<kj::OneOf<int,float,kj::String>>((OneOf<int,_float,_kj::String> *)local_30);
  OneOf<int,_float,_kj::String>::OneOf((OneOf<int,_float,_kj::String> *)local_468,pOVar6);
  pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>((OneOf<int,_float,_kj::String> *)local_30)
  ;
  bVar1 = kj::operator==("",pSVar4);
  if (!bVar1) {
    local_469 = _::Debug::shouldLog(ERROR);
    while (local_469 != false) {
      pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_30);
      _::Debug::log<char_const(&)[45],char_const(&)[1],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (var.get<String>())\", \"\", var.get<String>()"
                 ,(char (*) [45])"failed: expected (\"\") == (var.get<String>())",
                 (char (*) [1])0x632948,pSVar4);
      local_469 = false;
    }
  }
  pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                     ((OneOf<int,_float,_kj::String> *)local_468);
  bVar1 = kj::operator==("foo",pSVar4);
  if (!bVar1) {
    local_46a = _::Debug::shouldLog(ERROR);
    while (local_46a != false) {
      pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_468);
      _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x44,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (var2.get<String>())\", \"foo\", var2.get<String>()"
                 ,(char (*) [49])"failed: expected (\"foo\") == (var2.get<String>())",
                 (char (*) [4])0x654402,pSVar4);
      local_46a = false;
    }
  }
  pOVar6 = mv<kj::OneOf<int,float,kj::String>>((OneOf<int,_float,_kj::String> *)local_468);
  OneOf<int,_float,_kj::String>::operator=((OneOf<int,_float,_kj::String> *)local_30,pOVar6);
  pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>((OneOf<int,_float,_kj::String> *)local_30)
  ;
  bVar1 = kj::operator==("foo",pSVar4);
  if (!bVar1) {
    local_46b = _::Debug::shouldLog(ERROR);
    while (local_46b != false) {
      pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_30);
      _::Debug::log<char_const(&)[48],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (var.get<String>())\", \"foo\", var.get<String>()"
                 ,(char (*) [48])"failed: expected (\"foo\") == (var.get<String>())",
                 (char (*) [4])0x654402,pSVar4);
      local_46b = false;
    }
  }
  pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                     ((OneOf<int,_float,_kj::String> *)local_468);
  bVar1 = kj::operator==("",pSVar4);
  if (!bVar1) {
    local_46c = _::Debug::shouldLog(ERROR);
    while (local_46c != false) {
      pSVar4 = OneOf<int,_float,_kj::String>::get<kj::String>
                         ((OneOf<int,_float,_kj::String> *)local_468);
      _::Debug::log<char_const(&)[46],char_const(&)[1],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x48,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (var2.get<String>())\", \"\", var2.get<String>()"
                 ,(char (*) [46])"failed: expected (\"\") == (var2.get<String>())",
                 (char (*) [1])0x632948,pSVar4);
      local_46c = false;
    }
  }
  OneOf<int,_float,_kj::String>::~OneOf((OneOf<int,_float,_kj::String> *)local_468);
  OneOf<int,_float,_kj::String>::~OneOf((OneOf<int,_float,_kj::String> *)local_30);
  return;
}

Assistant:

TEST(OneOf, Basic) {
  OneOf<int, float, String> var;

  EXPECT_FALSE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_FALSE(var.is<String>());
  EXPECT_TRUE(var.tryGet<int>() == nullptr);
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_TRUE(var.tryGet<String>() == nullptr);

  var.init<int>(123);

  EXPECT_TRUE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_FALSE(var.is<String>());

  EXPECT_EQ(123, var.get<int>());
#if !KJ_NO_EXCEPTIONS && defined(KJ_DEBUG)
  EXPECT_ANY_THROW(var.get<float>());
  EXPECT_ANY_THROW(var.get<String>());
#endif

  EXPECT_EQ(123, KJ_ASSERT_NONNULL(var.tryGet<int>()));
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_TRUE(var.tryGet<String>() == nullptr);

  var.init<String>(kj::str("foo"));

  EXPECT_FALSE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_TRUE(var.is<String>());

  EXPECT_EQ("foo", var.get<String>());

  EXPECT_TRUE(var.tryGet<int>() == nullptr);
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_EQ("foo", KJ_ASSERT_NONNULL(var.tryGet<String>()));

  OneOf<int, float, String> var2 = kj::mv(var);
  EXPECT_EQ("", var.get<String>());
  EXPECT_EQ("foo", var2.get<String>());

  var = kj::mv(var2);
  EXPECT_EQ("foo", var.get<String>());
  EXPECT_EQ("", var2.get<String>());

  if (false) {
    var.allHandled<3>();
    // var.allHandled<2>();  // doesn't compile
  }
}